

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::base::utils::OS::termSupportsColor(void)

{
  bool bVar1;
  char *in_R8;
  bool local_41;
  undefined1 local_28 [8];
  string term;
  
  getEnvironmentVariable_abi_cxx11_((string *)local_28,(OS *)"TERM","",(char *)0x0,in_R8);
  bVar1 = ::std::operator==((string *)local_28,"xterm");
  local_41 = true;
  if (!bVar1) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_28,"xterm-color");
    local_41 = true;
    if (!bVar1) {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_28,"xterm-256color");
      local_41 = true;
      if (!bVar1) {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_28,"screen");
        local_41 = true;
        if (!bVar1) {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_28,"linux");
          local_41 = true;
          if (!bVar1) {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_28,"cygwin");
            local_41 = true;
            if (!bVar1) {
              local_41 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_28,"screen-256color");
            }
          }
        }
      }
    }
  }
  ::std::__cxx11::string::~string((string *)local_28);
  return local_41;
}

Assistant:

bool OS::termSupportsColor(void) {
  std::string term = getEnvironmentVariable("TERM", "");
  return term == "xterm" || term == "xterm-color" || term == "xterm-256color"
         || term == "screen" || term == "linux" || term == "cygwin"
         || term == "screen-256color";
}